

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O0

void __thiscall
license::test::env_var_point_to_wrong_file::test_method(env_var_point_to_wrong_file *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  ostream *this_00;
  lazy_ostream *plVar3;
  AuditEvent *pAVar4;
  undefined4 local_204;
  basic_cstring<const_char> local_200;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1f0;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  size_type local_1a8;
  undefined4 local_19c;
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_188;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8 [2];
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [8];
  EventRegistry registry;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  LicenseReader licenseReader;
  char *environment_variable_value;
  env_var_point_to_wrong_file *this_local;
  
  setenv("LICENSE_LOCATION",
         "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/this/file/doesnt/exist"
         ,1);
  locate::LocatorFactory::find_license_near_module(false);
  locate::LocatorFactory::find_license_with_env_var(true);
  LicenseReader::LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(LicenseLocation *)0x0);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"PRODUCT",&local_b1);
  LicenseReader::readLicenses
            ((EventRegistry *)local_90,
             (LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b0,
             (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  this_00 = license::operator<<((ostream *)std::cout,(EventRegistry *)local_90);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_d8,0x69,&local_e8);
    bVar2 = EventRegistry::isGood((EventRegistry *)local_90);
    boost::test_tools::assertion_result::assertion_result(&local_100,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,"!registry.isGood()",0x12);
    boost::unit_test::operator<<(&local_120,plVar3,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::test_tools::tt_detail::report_assertion(&local_100,&local_120,&local_140,0x69,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_150,0x6a,&local_160);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_188,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    local_19c = 0;
    local_1a8 = std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
                size((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                     &registry.current_validation_step);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
              (&local_188,&local_198,0x6a,1,2,&local_19c,"0",&local_1a8,"licenseInfos.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pAVar4 = EventRegistry::getLastFailure((EventRegistry *)local_90);
  if (pAVar4 == (AuditEvent *)0x0) {
    __assert_fail("registry.getLastFailure() != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
                  ,0x6b,"void license::test::env_var_point_to_wrong_file::test_method()");
  }
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1b8,0x6c,&local_1c8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1f0,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
               ,0x7c);
    local_204 = 1;
    pAVar4 = EventRegistry::getLastFailure((EventRegistry *)local_90);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,LCC_EVENT_TYPE,LCC_EVENT_TYPE>
              (&local_1f0,&local_200,0x6c,1,2,&local_204,"LICENSE_FILE_NOT_FOUND",
               &pAVar4->event_type,"registry.getLastFailure()->event_type");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  unsetenv("LICENSE_LOCATION");
  EventRegistry::~EventRegistry((EventRegistry *)local_90);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &registry.current_validation_step);
  LicenseReader::~LicenseReader
            ((LicenseReader *)
             &licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(env_var_point_to_wrong_file) {
	const char *environment_variable_value = PROJECT_TEST_SRC_DIR "/this/file/doesnt/exist";
	SETENV(LCC_LICENSE_LOCATION_ENV_VAR, environment_variable_value)
	locate::LocatorFactory::find_license_near_module(false);
	locate::LocatorFactory::find_license_with_env_var(true);

	LicenseReader licenseReader(nullptr);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT", licenseInfos);
	cout << registry << endl;
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_EQUAL(LICENSE_FILE_NOT_FOUND, registry.getLastFailure()->event_type);
	UNSETENV(LCC_LICENSE_LOCATION_ENV_VAR);
}